

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_test.cpp
# Opt level: O0

void __thiscall SRGB_LUTAccuracy_Test::~SRGB_LUTAccuracy_Test(SRGB_LUTAccuracy_Test *this)

{
  void *in_RDI;
  
  ~SRGB_LUTAccuracy_Test((SRGB_LUTAccuracy_Test *)0x5a0628);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SRGB, LUTAccuracy) {
    const int n = 1024 * 1024;
    double sumErr = 0, maxErr = 0;
    RNG rng;
    for (int i = 0; i < n; ++i) {
        Float v = (i + rng.Uniform<Float>()) / n;
        Float lut = LinearToSRGB(v);
        Float precise = LinearToSRGBFull(v);
        double err = std::abs(lut - precise);
        sumErr += err;
        maxErr = std::max(err, maxErr);
    }
    // These bounds were measured empirically.
    EXPECT_LT(sumErr / n, 6e-6);  // average error
    EXPECT_LT(maxErr, 0.0015);
}